

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_group.hpp
# Opt level: O2

void __thiscall
oqpi::
parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)0,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
::executeSingleThreadedImpl
          (parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)0,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
           *this)

{
  code *pcVar1;
  bool bVar2;
  eAssertResult eVar3;
  long lVar4;
  __int_type_conflict _Var5;
  
  bVar2 = task_base::tryGrab((task_base *)this);
  if (!bVar2) {
    return;
  }
  lVar4 = (long)(this->tasks_).
                super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->tasks_).
                super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar4 == 0) {
    bVar2 = assert_and_return_false
                      ("/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/parallel_group.hpp"
                       ,0x34,"taskCount > 0","");
    if (!bVar2) goto LAB_0019c86c;
  }
  _Var5 = lVar4 >> 4;
  if ((executeSingleThreadedImpl::always_ignore == false) &&
     (_Var5 != (this->activeTasksCount_).super___atomic_base<unsigned_long>._M_i)) {
    eVar3 = assert_function("/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/parallel_group.hpp"
                            ,0x36,"(taskCount == activeTasksCount_)","");
    if (eVar3 == eAR_AlwaysIgnore) {
      executeSingleThreadedImpl::always_ignore = true;
    }
    else if (eVar3 == eAR_Retry) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
  }
  lVar4 = 0;
  while (bVar2 = _Var5 != 0, _Var5 = _Var5 - 1, bVar2) {
    task_handle::executeSingleThreaded
              ((task_handle *)
               ((long)&(((this->tasks_).
                         super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>.
                         _M_impl.super__Vector_impl_data._M_start)->spTask_).
                       super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
               lVar4));
    lVar4 = lVar4 + 0x10;
  }
LAB_0019c86c:
  std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::clear(&this->tasks_);
  return;
}

Assistant:

virtual void executeSingleThreadedImpl() override final
        {
            if (task_base::tryGrab())
            {
                const auto taskCount = tasks_.size();
                if (oqpi_ensure(taskCount > 0))
                {
                    oqpi_check(taskCount == activeTasksCount_);
                    for (size_t i = 0; i < taskCount; ++i)
                    {
                        tasks_[i].executeSingleThreaded();
                    }
                }
                tasks_.clear();
            }
        }